

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainGoalPredictor.cpp
# Opt level: O3

pair<tiger::trains::world::IPost_*,_int> __thiscall
tiger::trains::ai::TrainGoalPredictor::predictGoal(TrainGoalPredictor *this,Train *train)

{
  mapped_type mVar1;
  pointer ppPVar2;
  pointer ppIVar3;
  IPost *pIVar4;
  Train *pTVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GoodType GVar9;
  World *pWVar10;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *pvVar11;
  mapped_type *pmVar12;
  Line *pLVar13;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar14;
  Player *this_00;
  IPost *pIVar15;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppIVar17;
  pointer ppLVar18;
  pointer ppPVar19;
  pair<std::_Rb_tree_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::_Rb_tree_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  pVar20;
  pair<tiger::trains::world::IPost_*,_int> pVar21;
  Point *another;
  Point *minPoint;
  Point *endPoint;
  Point *startPoint;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  setMinLen;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  minLen;
  Point *local_d0;
  Point *local_c8;
  pair<int,_const_tiger::trains::world::Point_*> local_c0;
  Train *local_b0;
  Point *local_a8;
  Point *local_a0;
  pointer local_98;
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  local_90;
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = train;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pWVar10 = world::Train::getWorld(train);
  pvVar11 = world::World::getPointList(pWVar10);
  ppPVar19 = (pvVar11->
             super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (pvVar11->
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar19 != ppPVar2) {
    do {
      local_90._M_impl._0_8_ = *ppPVar19;
      pmVar12 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                              *)&local_60,(key_type *)&local_90);
      *pmVar12 = 0x7fffffff;
      ppPVar19 = ppPVar19 + 1;
    } while (ppPVar19 != ppPVar2);
  }
  pTVar5 = local_b0;
  pLVar13 = world::Train::getLine(local_b0);
  local_a0 = world::Line::getStartPont(pLVar13);
  iVar6 = world::Train::getPosition(pTVar5);
  pLVar13 = world::Train::getLine(pTVar5);
  local_a8 = world::Line::getEndPont(pLVar13);
  pLVar13 = world::Train::getLine(pTVar5);
  iVar7 = world::Line::getLenght(pLVar13);
  iVar8 = world::Train::getPosition(pTVar5);
  pmVar12 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,&local_a0);
  *pmVar12 = iVar6;
  pmVar12 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,&local_a8);
  *pmVar12 = iVar7 - iVar8;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.second = local_a0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.first = iVar6;
  std::
  _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
  ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
            ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
              *)&local_90,&local_c0);
  local_c0.first = iVar7 - iVar8;
  local_c0.second = local_a8;
  std::
  _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
  ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
            ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
              *)&local_90,&local_c0);
  if (local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      local_c8 = *(Point **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      std::
      _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                          *)&local_90,
                         (const_iterator)local_90._M_impl.super__Rb_tree_header._M_header._M_left);
      pvVar14 = world::Point::getEdges(local_c8);
      ppLVar18 = (pvVar14->
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_98 = (pvVar14->
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (ppLVar18 != local_98) {
        do {
          pLVar13 = *ppLVar18;
          local_d0 = world::Line::getAnotherPoint(pLVar13,local_c8);
          pmVar12 = std::
                    map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                    ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                  *)&local_60,&local_d0);
          iVar6 = *pmVar12;
          pmVar12 = std::
                    map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                    ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                  *)&local_60,&local_c8);
          iVar7 = *pmVar12;
          iVar8 = world::Line::getLenght(pLVar13);
          if (iVar8 + iVar7 < iVar6) {
            pmVar12 = std::
                      map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                      ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                    *)&local_60,&local_d0);
            local_c0.second = local_d0;
            local_c0.first = *pmVar12;
            pVar20 = std::
                     _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                     ::equal_range(&local_90,&local_c0);
            std::
            _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
            ::_M_erase_aux(&local_90,(_Base_ptr)pVar20.first._M_node,
                           (_Base_ptr)pVar20.second._M_node);
            pmVar12 = std::
                      map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                      ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                    *)&local_60,&local_c8);
            iVar6 = *pmVar12;
            iVar7 = world::Line::getLenght(pLVar13);
            pmVar12 = std::
                      map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                      ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                    *)&local_60,&local_d0);
            *pmVar12 = iVar7 + iVar6;
            pmVar12 = std::
                      map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                      ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                                    *)&local_60,&local_d0);
            local_c0.first = *pmVar12;
            local_c0.second = local_d0;
            std::
            _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
            ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
                      ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                        *)&local_90,&local_c0);
          }
          ppLVar18 = ppLVar18 + 1;
        } while (ppLVar18 != local_98);
      }
    } while (local_90._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  pTVar5 = local_b0;
  this_00 = world::Train::getPlayer(local_b0);
  pIVar15 = world::Player::getHome(this_00);
  pWVar10 = world::Train::getWorld(pTVar5);
  pvVar16 = world::World::getPostList(pWVar10);
  ppIVar17 = (pvVar16->
             super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (pvVar16->
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar17 != ppIVar3) {
    do {
      pIVar4 = *ppIVar17;
      local_c0.first = (*pIVar15->_vptr_IPost[5])(pIVar15);
      local_c0._4_4_ = extraout_var;
      pmVar12 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                              *)&local_60,(key_type *)&local_c0);
      iVar6 = *pmVar12;
      iVar7 = (*pIVar4->_vptr_IPost[5])(pIVar4);
      local_c8 = (Point *)CONCAT44(extraout_var_00,iVar7);
      pmVar12 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                              *)&local_60,&local_c8);
      if (*pmVar12 < iVar6) {
        iVar6 = (*pIVar4->_vptr_IPost[7])(pIVar4);
        if (iVar6 == 2) {
          GVar9 = world::Train::getGoodsType(local_b0);
          if (GVar9 == PRODUCT) {
            pIVar15 = pIVar4;
          }
        }
        iVar6 = (*pIVar4->_vptr_IPost[7])(pIVar4);
        if (iVar6 == 3) {
          GVar9 = world::Train::getGoodsType(local_b0);
          if (GVar9 == ARMOR) {
            pIVar15 = pIVar4;
          }
        }
      }
      ppIVar17 = ppIVar17 + 1;
    } while (ppIVar17 != ppIVar3);
  }
  local_c0.first = (*pIVar15->_vptr_IPost[5])(pIVar15);
  local_c0._4_4_ = extraout_var_01;
  pmVar12 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[]((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                          *)&local_60,(key_type *)&local_c0);
  mVar1 = *pmVar12;
  std::
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~_Rb_tree(&local_60);
  pVar21.second = mVar1;
  pVar21.first = pIVar15;
  pVar21._12_4_ = 0;
  return pVar21;
}

Assistant:

std::pair<world::IPost *, int> TrainGoalPredictor::predictGoal(const world::Train *train)
{
    std::map<const world::Point *, int> minLen;

    for (auto point : train->getWorld()->getPointList())
        minLen[point] = INT_MAX;

    const world::Point *startPoint = train->getLine()->getStartPont();
    int lenToStart = train->getPosition();
    const world::Point *endPoint = train->getLine()->getEndPont();
    int lenToEnd = train->getLine()->getLenght() - train->getPosition();

    minLen[startPoint] = lenToStart;
    minLen[endPoint] = lenToEnd;

    std::set< std::pair<int, const world::Point *>> setMinLen;
    setMinLen.insert({lenToStart, startPoint});
    setMinLen.insert({lenToEnd, endPoint});

    while (!setMinLen.empty())
    {
        auto minPoint = minLen.begin()->first;
        setMinLen.erase(setMinLen.begin());

        for (auto line : minPoint->getEdges())
        {
            const world::Point *another = line->getAnotherPoint(minPoint);

            if (minLen[another] > minLen[minPoint] + line->getLenght())
            {
                setMinLen.erase({minLen[another], another});
                minLen[another] = minLen[minPoint] + line->getLenght();
                setMinLen.insert({minLen[another], another});
            }
        }

    }

    world::IPost *minPost = train->getPlayer()->getHome();

    for (world::IPost *post : train->getWorld()->getPostList())
        if (minLen[minPost->getPoint()] > minLen[post->getPoint()])
        {
            if (post->getPostType() == models::PostType::MARKET && train->getGoodsType() == models::GoodType::PRODUCT)
                minPost = post;

            if (post->getPostType() == models::PostType::STORAGE && train->getGoodsType() == models::GoodType::ARMOR)
                minPost = post;
        }

    return std::make_pair(minPost, minLen[minPost->getPoint()]);
}